

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_litLengthPrice(U32 litLength,optState_t *optPtr,int optLevel)

{
  byte bVar1;
  int iVar2;
  U32 UVar3;
  int in_EDX;
  long in_RSI;
  uint in_EDI;
  U32 llCode;
  U32 local_24;
  U32 in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  U32 local_4;
  
  if (0x20000 < in_EDI) {
    __assert_fail("litLength <= ZSTD_BLOCKSIZE_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8049,"U32 ZSTD_litLengthPrice(const U32, const optState_t *const, int)");
  }
  if (*(int *)(in_RSI + 0x50) == 1) {
    if (in_EDX == 0) {
      local_4 = ZSTD_bitWeight(0);
    }
    else {
      local_4 = ZSTD_fracWeight(in_stack_ffffffffffffffe4);
    }
  }
  else if (in_EDI == 0x20000) {
    local_4 = ZSTD_litLengthPrice((U32)in_RSI,
                                  (optState_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                                  in_stack_ffffffffffffffe4);
    local_4 = local_4 + 0x100;
  }
  else {
    UVar3 = ZSTD_LLcode(0);
    bVar1 = ""[UVar3];
    iVar2 = *(int *)(in_RSI + 0x44);
    if (in_EDX == 0) {
      local_24 = ZSTD_bitWeight(0);
    }
    else {
      local_24 = ZSTD_fracWeight(in_stack_ffffffffffffffe4);
    }
    local_4 = ((uint)bVar1 * 0x100 + iVar2) - local_24;
  }
  return local_4;
}

Assistant:

static U32 ZSTD_litLengthPrice(U32 const litLength, const optState_t* const optPtr, int optLevel)
{
    assert(litLength <= ZSTD_BLOCKSIZE_MAX);
    if (optPtr->priceType == zop_predef)
        return WEIGHT(litLength, optLevel);

    /* ZSTD_LLcode() can't compute litLength price for sizes >= ZSTD_BLOCKSIZE_MAX
     * because it isn't representable in the zstd format.
     * So instead just pretend it would cost 1 bit more than ZSTD_BLOCKSIZE_MAX - 1.
     * In such a case, the block would be all literals.
     */
    if (litLength == ZSTD_BLOCKSIZE_MAX)
        return BITCOST_MULTIPLIER + ZSTD_litLengthPrice(ZSTD_BLOCKSIZE_MAX - 1, optPtr, optLevel);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        return (LL_bits[llCode] * BITCOST_MULTIPLIER)
             + optPtr->litLengthSumBasePrice
             - WEIGHT(optPtr->litLengthFreq[llCode], optLevel);
    }
}